

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O2

void Fraig_TableResizeF(Fraig_HashTable_t *p,int fUseSimR)

{
  uint uVar1;
  ulong uVar2;
  Fraig_Node_t *pFVar3;
  uint uVar4;
  Fraig_Node_t **ppFVar5;
  ulong uVar6;
  int iVar7;
  Fraig_Node_t *pFVar8;
  Fraig_Node_t *pFVar9;
  ulong uVar10;
  
  Abc_Clock();
  uVar1 = p->nBins;
  uVar4 = Abc_PrimeCudd(uVar1 * 2);
  ppFVar5 = (Fraig_Node_t **)calloc(1,(long)(int)uVar4 << 3);
  uVar6 = 0;
  uVar10 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar10 = uVar6;
  }
  iVar7 = 0;
  for (; uVar6 != uVar10; uVar6 = uVar6 + 1) {
    pFVar8 = p->pBins[uVar6];
    if (pFVar8 != (Fraig_Node_t *)0x0) goto LAB_0054cf3a;
    pFVar3 = (Fraig_Node_t *)0x0;
    pFVar9 = pFVar8;
    while (pFVar8 = pFVar3, pFVar9 != (Fraig_Node_t *)0x0) {
      uVar2 = (ulong)(&pFVar9->uHashR)[fUseSimR == 0] % (ulong)uVar4;
      pFVar9->pNextF = ppFVar5[uVar2];
      ppFVar5[uVar2] = pFVar9;
      iVar7 = iVar7 + 1;
      pFVar3 = (Fraig_Node_t *)0x0;
      pFVar9 = pFVar8;
      if (pFVar8 != (Fraig_Node_t *)0x0) {
LAB_0054cf3a:
        pFVar3 = pFVar8->pNextF;
        pFVar9 = pFVar8;
      }
    }
  }
  if (iVar7 != p->nEntries) {
    __assert_fail("Counter == p->nEntries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigTable.c"
                  ,0x14a,"void Fraig_TableResizeF(Fraig_HashTable_t *, int)");
  }
  free(p->pBins);
  p->pBins = ppFVar5;
  p->nBins = uVar4;
  return;
}

Assistant:

void Fraig_TableResizeF( Fraig_HashTable_t * p, int fUseSimR )
{
    Fraig_Node_t ** pBinsNew;
    Fraig_Node_t * pEnt, * pEnt2;
    int nBinsNew, Counter, i;
    abctime clk;
    unsigned Key;

clk = Abc_Clock();
    // get the new table size
    nBinsNew = Abc_PrimeCudd(2 * p->nBins); 
    // allocate a new array
    pBinsNew = ABC_ALLOC( Fraig_Node_t *, nBinsNew );
    memset( pBinsNew, 0, sizeof(Fraig_Node_t *) * nBinsNew );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < p->nBins; i++ )
        Fraig_TableBinForEachEntrySafeF( p->pBins[i], pEnt, pEnt2 )
        {
            if ( fUseSimR )
                Key = pEnt->uHashR % nBinsNew;
            else
                Key = pEnt->uHashD % nBinsNew;
            pEnt->pNextF = pBinsNew[Key];
            pBinsNew[Key] = pEnt;
            Counter++;
        }
    assert( Counter == p->nEntries );
//    printf( "Increasing the functional table size from %6d to %6d. ", p->nBins, nBinsNew );
//    ABC_PRT( "Time", Abc_Clock() - clk );
    // replace the table and the parameters
    ABC_FREE( p->pBins );
    p->pBins = pBinsNew;
    p->nBins = nBinsNew;
}